

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

ostream * CLI::detail::streamOutAsParagraph
                    (ostream *out,string *text,size_t paragraphWidth,string *linePrefix,
                    bool skipPrefixOnFirstLine)

{
  istream *piVar1;
  ostream *poVar2;
  undefined3 in_register_00000081;
  long lVar3;
  allocator local_379;
  string *local_378;
  string word;
  string line;
  istringstream lss;
  byte abStack_310 [352];
  istringstream iss;
  
  local_378 = linePrefix;
  if (CONCAT31(in_register_00000081,skipPrefixOnFirstLine) == 0) {
    ::std::operator<<(out,(string *)linePrefix);
  }
  ::std::__cxx11::istringstream::istringstream((istringstream *)&lss,(string *)text,_S_in);
  ::std::__cxx11::string::string((string *)&line,"",(allocator *)&iss);
  while( true ) {
    piVar1 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&lss,(string *)&line);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    ::std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&line,_S_in);
    ::std::__cxx11::string::string((string *)&word,"",&local_379);
    lVar3 = 0;
    while( true ) {
      piVar1 = ::std::operator>>((istream *)&iss,(string *)&word);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      if (paragraphWidth < word._M_string_length + lVar3) {
        poVar2 = ::std::operator<<(out,'\n');
        ::std::operator<<(poVar2,(string *)local_378);
        lVar3 = 0;
      }
      if (*word._M_dataplus._M_p == '\"') {
        ::std::operator<<(out,"  ");
      }
      poVar2 = ::std::operator<<(out,(string *)&word);
      ::std::operator<<(poVar2," ");
      lVar3 = lVar3 + word._M_string_length + 1;
    }
    if ((abStack_310[*(long *)(_lss + -0x18)] & 2) == 0) {
      poVar2 = ::std::operator<<(out,'\n');
      ::std::operator<<(poVar2,(string *)local_378);
    }
    ::std::__cxx11::string::~string((string *)&word);
    ::std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  }
  ::std::__cxx11::string::~string((string *)&line);
  ::std::__cxx11::istringstream::~istringstream((istringstream *)&lss);
  return out;
}

Assistant:

CLI11_INLINE std::ostream &streamOutAsParagraph(std::ostream &out,
                                                const std::string &text,
                                                std::size_t paragraphWidth,
                                                const std::string &linePrefix,
                                                bool skipPrefixOnFirstLine) {
    if(!skipPrefixOnFirstLine)
        out << linePrefix;  // First line prefix

    std::istringstream lss(text);
    std::string line = "";
    while(std::getline(lss, line)) {
        std::istringstream iss(line);
        std::string word = "";
        std::size_t charsWritten = 0;

        while(iss >> word) {
            if(word.length() + charsWritten > paragraphWidth) {
                out << '\n' << linePrefix;
                charsWritten = 0;
            }
            
            if(word[0] == '\"')
                out << "  ";
            out << word << " ";
            charsWritten += word.length() + 1;
        }

        if(!lss.eof())
            out << '\n' << linePrefix;
    }
    return out;
}